

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

uint64 crnlib::dxt_fast::determine_error
                 (uint n,color_quad_u8 *block,uint min16,uint max16,uint64 early_out_error)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  color_quad<unsigned_char,_int> *this;
  color_quad<unsigned_char,_int> *this_00;
  color_quad<unsigned_char,_int> *local_a0;
  int e;
  color_quad_u8 *b;
  int dot;
  uint s;
  color_quad_u8 *a;
  ulong uStack_70;
  uint i_1;
  uint64 total_error;
  int c3Point;
  int halfPoint;
  int c0Point;
  int i;
  int stops [4];
  int dirb;
  int dirg;
  int dirr;
  color_quad_u8 color [4];
  uint64 early_out_error_local;
  uint max16_local;
  uint min16_local;
  color_quad_u8 *block_local;
  uint n_local;
  
  local_a0 = (color_quad<unsigned_char,_int> *)&dirg;
  color._8_8_ = early_out_error;
  do {
    color_quad<unsigned_char,_int>::color_quad(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != color + 2);
  eval_colors((color_quad_u8 *)&dirg,min16,max16);
  stops[3] = (uint)dirg._2_1_ - (uint)dirr._2_1_;
  for (halfPoint = 0; halfPoint < 4; halfPoint = halfPoint + 1) {
    (&c0Point)[halfPoint] =
         (uint)*(byte *)(&dirg + halfPoint) * ((uint)(byte)dirg - (uint)(byte)dirr) +
         (uint)*(byte *)((long)&dirg + (long)halfPoint * 4 + 1) *
         ((uint)dirg._1_1_ - (uint)dirr._1_1_) +
         (uint)*(byte *)((long)&dirg + (long)halfPoint * 4 + 2) * stops[3];
  }
  uStack_70 = 0;
  a._4_4_ = 0;
  while( true ) {
    if (n <= a._4_4_) {
      return uStack_70;
    }
    this = block + a._4_4_;
    b._4_4_ = 0;
    if (min16 != max16) {
      iVar7 = (uint)(this->field_0).field_0.r * ((uint)(byte)dirg - (uint)(byte)dirr) +
              (uint)(this->field_0).field_0.g * ((uint)dirg._1_1_ - (uint)dirr._1_1_) +
              (uint)(this->field_0).field_0.b * stops[3];
      if (iVar7 < stops[1] + stops[0] >> 1) {
        b._4_4_ = 3;
        if (iVar7 < i + stops[1] >> 1) {
          b._4_4_ = 1;
        }
      }
      else {
        b._4_4_ = 0;
        if (iVar7 < stops[0] + c0Point >> 1) {
          b._4_4_ = 2;
        }
      }
    }
    this_00 = (color_quad<unsigned_char,_int> *)(&dirg + b._4_4_);
    bVar1 = color_quad<unsigned_char,_int>::operator[](this,0);
    bVar2 = color_quad<unsigned_char,_int>::operator[](this_00,0);
    bVar3 = color_quad<unsigned_char,_int>::operator[](this,1);
    bVar4 = color_quad<unsigned_char,_int>::operator[](this_00,1);
    bVar5 = color_quad<unsigned_char,_int>::operator[](this,2);
    bVar6 = color_quad<unsigned_char,_int>::operator[](this_00,2);
    uStack_70 = (long)(int)(((uint)bVar5 - (uint)bVar6) * ((uint)bVar5 - (uint)bVar6)) +
                (long)(int)(((uint)bVar3 - (uint)bVar4) * ((uint)bVar3 - (uint)bVar4)) +
                (long)(int)(((uint)bVar1 - (uint)bVar2) * ((uint)bVar1 - (uint)bVar2)) + uStack_70;
    if ((ulong)color._8_8_ <= uStack_70) break;
    a._4_4_ = a._4_4_ + 1;
  }
  return uStack_70;
}

Assistant:

static uint64 determine_error(uint n, const color_quad_u8* block, uint min16, uint max16, uint64 early_out_error)
        {
            color_quad_u8 color[4];

            eval_colors(color, min16, max16);

            int dirr = color[0].r - color[1].r;
            int dirg = color[0].g - color[1].g;
            int dirb = color[0].b - color[1].b;

            int stops[4];
            for (int i = 0; i < 4; i++)
            {
                stops[i] = color[i].r * dirr + color[i].g * dirg + color[i].b * dirb;
            }

            // 0 2 3 1
            int c0Point = stops[1] + stops[3];
            int halfPoint = stops[3] + stops[2];
            int c3Point = stops[2] + stops[0];

            c0Point >>= 1;
            halfPoint >>= 1;
            c3Point >>= 1;

            uint64 total_error = 0;

            for (uint i = 0; i < n; i++)
            {
                const color_quad_u8& a = block[i];

                uint s = 0;
                if (min16 != max16)
                {
                    int dot = a.r * dirr + a.g * dirg + a.b * dirb;

                    if (dot < halfPoint)
                    {
                        s = (dot < c0Point) ? 1 : 3;
                    }
                    else
                    {
                        s = (dot < c3Point) ? 2 : 0;
                    }
                }

                const color_quad_u8& b = color[s];

                int e = a[0] - b[0];
                total_error += e * e;

                e = a[1] - b[1];
                total_error += e * e;

                e = a[2] - b[2];
                total_error += e * e;

                if (total_error >= early_out_error)
                {
                    break;
                }
            }

            return total_error;
        }